

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O1

void __thiscall OpenMD::AngleR::process(AngleR *this)

{
  SelectionManager *this_00;
  double *pdVar1;
  int *piVar2;
  double dVar3;
  pointer pOVar4;
  char cVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer __s;
  pointer piVar8;
  double dVar9;
  uint i;
  int iVar10;
  int iVar11;
  StuntDouble *pSVar12;
  SelectionSet *pSVar13;
  StuntDouble *pSVar14;
  uint i_3;
  pointer *ppOVar15;
  uint i_2;
  double (*__return_storage_ptr__) [3];
  uint whichFrame;
  pointer *ppOVar16;
  long lVar17;
  long lVar18;
  double tmp;
  Vector<double,_3U> result_4;
  int ii;
  Vector<double,_3U> result_3;
  SquareMatrix3<double> result;
  int jj;
  Vector<double,_3U> result_2;
  Vector3d CenterOfMass;
  Vector<double,_3U> result_1;
  Thermo thermo;
  DumpReader reader;
  Vector3d local_13e8;
  Vector3d local_13c8;
  int local_13ac;
  pointer local_13a8 [4];
  double local_1388;
  uint local_137c;
  SelectionSet local_1378;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  int local_1328;
  int local_1324;
  SelectionManager *local_1320;
  pointer local_1318 [9];
  Vector3d local_12d0;
  pointer local_12b8 [3];
  SelectionEvaluator *local_12a0;
  SelectionEvaluator *local_1298;
  Thermo local_1290;
  DumpReader local_1288;
  
  local_1290.info_ = (this->super_StaticAnalyser).info_;
  cVar5 = ((local_1290.info_)->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.
          field_0x2b;
  DumpReader::DumpReader(&local_1288,local_1290.info_,&(this->super_StaticAnalyser).dumpFilename_);
  iVar10 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar10 / (this->super_StaticAnalyser).step_;
  pdVar6 = (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar6 != pdVar7) {
    memset(pdVar6,0,((long)pdVar7 + (-8 - (long)pdVar6) & 0xfffffffffffffff8U) + 8);
  }
  pdVar6 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar6 != pdVar7) {
    memset(pdVar6,0,((long)pdVar7 + (-8 - (long)pdVar6) & 0xfffffffffffffff8U) + 8);
  }
  __s = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start;
  piVar8 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != piVar8) {
    memset(__s,0,((long)piVar8 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  local_1328 = iVar10;
  if (0 < iVar10) {
    local_1298 = &this->evaluator1_;
    local_12a0 = &this->evaluator2_;
    this_00 = &this->seleMan1_;
    local_1320 = &this->seleMan2_;
    whichFrame = 0;
    do {
      local_137c = whichFrame;
      DumpReader::readFrame(&local_1288,whichFrame);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      Thermo::getCom(&local_12d0,&local_1290);
      if ((this->evaluator1_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1378,local_1298);
        lVar18 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan1_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar18),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1378.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar18));
          lVar18 = lVar18 + 0x28;
        } while (lVar18 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1378.bitsets_);
      }
      if (this->doVect_ == true) {
        pSVar12 = SelectionManager::beginSelected(this_00,&local_13ac);
        while (pSVar12 != (StuntDouble *)0x0) {
          lVar18 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar12->storage_);
          local_13e8.super_Vector<double,_3U>.data_[2] =
               *(double *)(lVar18 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
          pdVar1 = (double *)(lVar18 + (long)pSVar12->localIndex_ * 0x18);
          local_13e8.super_Vector<double,_3U>.data_[0] = *pdVar1;
          local_13e8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar18 = 0;
          do {
            (&local_1378.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar18] =
                 (pointer)(local_12d0.super_Vector<double,_3U>.data_[lVar18] -
                          local_13e8.super_Vector<double,_3U>.data_[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_13c8.super_Vector<double,_3U>.data_[2] =
               (double)local_1378.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_13c8.super_Vector<double,_3U>.data_[0] =
               (double)local_1378.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          local_13c8.super_Vector<double,_3U>.data_[1] =
               (double)local_1378.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          dVar9 = 0.0;
          lVar18 = 0;
          do {
            dVar3 = local_13c8.super_Vector<double,_3U>.data_[lVar18];
            dVar9 = dVar9 + dVar3 * dVar3;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          if (dVar9 < 0.0) {
            local_1388 = sqrt(dVar9);
          }
          else {
            local_1388 = SQRT(dVar9);
          }
          if (pSVar12->objType_ - otDAtom < 2) {
            __return_storage_ptr__ = (double (*) [3])local_1318;
            StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,pSVar12);
            local_1348 = 0;
            uStack_1340 = 0;
            local_1358 = 0;
            uStack_1350 = 0;
            local_1378.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uStack_1360 = 0;
            local_1378.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1378.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1338 = 0;
            ppOVar15 = (pointer *)&local_1378;
            lVar18 = 0;
            do {
              lVar17 = 0;
              ppOVar16 = ppOVar15;
              do {
                (((SelectionSet *)ppOVar16)->bitsets_).
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)(((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                              super_RectMatrix<double,_3U,_3U>).data_[0][lVar17];
                lVar17 = lVar17 + 1;
                ppOVar16 = (pointer *)((long)ppOVar16 + 0x18);
              } while (lVar17 != 3);
              lVar18 = lVar18 + 1;
              ppOVar15 = ppOVar15 + 1;
              __return_storage_ptr__ = __return_storage_ptr__ + 1;
            } while (lVar18 != 3);
            local_12b8[0] = (pointer)0x0;
            local_12b8[1] = (pointer)0x0;
            local_12b8[2] = (pointer)0x0;
            pSVar13 = &local_1378;
            lVar18 = 0;
            do {
              pOVar4 = local_12b8[lVar18];
              lVar17 = 0;
              do {
                pOVar4 = (pointer)((double)pOVar4 +
                                  *(double *)
                                   ((long)&(pSVar13->bitsets_).
                                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar17) *
                                  *(double *)((long)&OpenMD::V3Z + lVar17));
                lVar17 = lVar17 + 8;
              } while (lVar17 != 0x18);
              local_12b8[lVar18] = pOVar4;
              lVar18 = lVar18 + 1;
              pSVar13 = pSVar13 + 1;
            } while (lVar18 != 3);
            local_13a8[2] = local_12b8[2];
            local_13a8[0] = local_12b8[0];
            local_13a8[1] = local_12b8[1];
            dVar9 = 0.0;
            lVar18 = 0;
            do {
              dVar9 = dVar9 + (double)local_13a8[lVar18] * (double)local_13a8[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            if (dVar9 < 0.0) {
              dVar9 = sqrt(dVar9);
            }
            else {
              dVar9 = SQRT(dVar9);
            }
            lVar18 = 0;
            do {
              local_13a8[lVar18] = (pointer)((double)local_13a8[lVar18] / dVar9);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            dVar9 = 0.0;
            lVar18 = 0;
            do {
              dVar3 = local_13c8.super_Vector<double,_3U>.data_[lVar18];
              dVar9 = dVar9 + dVar3 * dVar3;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            if (dVar9 < 0.0) {
              dVar9 = sqrt(dVar9);
            }
            else {
              dVar9 = SQRT(dVar9);
            }
            lVar18 = 0;
            do {
              local_13c8.super_Vector<double,_3U>.data_[lVar18] =
                   local_13c8.super_Vector<double,_3U>.data_[lVar18] / dVar9;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            dVar9 = 0.0;
            lVar18 = 0;
            do {
              dVar9 = dVar9 + local_13c8.super_Vector<double,_3U>.data_[lVar18] *
                              (double)local_13a8[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            if (local_1388 < this->len_) {
              iVar10 = (int)(local_1388 / this->deltaR_);
              pdVar6 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pdVar6[iVar10] = dVar9 + pdVar6[iVar10];
              piVar2 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar10;
              *piVar2 = *piVar2 + 1;
            }
          }
          pSVar12 = SelectionManager::nextSelected(this_00,&local_13ac);
        }
      }
      else if (this->doOffset_ == true) {
        pSVar12 = SelectionManager::beginSelected(this_00,&local_13ac);
        while (pSVar12 != (StuntDouble *)0x0) {
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (this->doOffset2_ == true) {
            pSVar14 = SimInfo::getIOIndexToIntegrableObject
                                ((this->super_StaticAnalyser).info_,
                                 this->seleOffset2_ + pSVar12->globalIndex_);
            lVar18 = *(long *)((long)&(pSVar14->snapshotMan_->currentSnapshot_->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar14->storage_)
            ;
            local_13e8.super_Vector<double,_3U>.data_[2] =
                 *(double *)(lVar18 + 0x10 + (long)pSVar14->localIndex_ * 0x18);
            pdVar1 = (double *)(lVar18 + (long)pSVar14->localIndex_ * 0x18);
            local_13e8.super_Vector<double,_3U>.data_[0] = *pdVar1;
            local_13e8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
            local_1318[0] = (pointer)0x0;
            local_1318[1] = (pointer)0x0;
            local_1318[2] = (pointer)0x0;
            lVar18 = 0;
            do {
              local_1318[lVar18] =
                   (pointer)(local_12d0.super_Vector<double,_3U>.data_[lVar18] -
                            local_13e8.super_Vector<double,_3U>.data_[lVar18]);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
          }
          else {
            lVar18 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar12->storage_)
            ;
            local_13e8.super_Vector<double,_3U>.data_[2] =
                 *(double *)(lVar18 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
            pdVar1 = (double *)(lVar18 + (long)pSVar12->localIndex_ * 0x18);
            local_13e8.super_Vector<double,_3U>.data_[0] = *pdVar1;
            local_13e8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
            local_1318[0] = (pointer)0x0;
            local_1318[1] = (pointer)0x0;
            local_1318[2] = (pointer)0x0;
            lVar18 = 0;
            do {
              local_1318[lVar18] =
                   (pointer)(local_12d0.super_Vector<double,_3U>.data_[lVar18] -
                            local_13e8.super_Vector<double,_3U>.data_[lVar18]);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
          }
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_1318[2];
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = local_1318[0];
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_finish = local_1318[1];
          if (cVar5 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1378);
          }
          pSVar12 = SimInfo::getIOIndexToIntegrableObject
                              ((this->super_StaticAnalyser).info_,
                               this->seleOffset_ + pSVar12->globalIndex_);
          lVar18 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar12->storage_);
          local_13c8.super_Vector<double,_3U>.data_[2] =
               *(double *)(lVar18 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
          pdVar1 = (double *)(lVar18 + (long)pSVar12->localIndex_ * 0x18);
          local_13c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
          local_13c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
          local_13e8.super_Vector<double,_3U>.data_[0] = 0.0;
          local_13e8.super_Vector<double,_3U>.data_[1] = 0.0;
          local_13e8.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar18 = 0;
          do {
            local_13e8.super_Vector<double,_3U>.data_[lVar18] =
                 local_12d0.super_Vector<double,_3U>.data_[lVar18] -
                 local_13c8.super_Vector<double,_3U>.data_[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_1318[2] = (pointer)local_13e8.super_Vector<double,_3U>.data_[2];
          local_1318[0] = (pointer)local_13e8.super_Vector<double,_3U>.data_[0];
          local_1318[1] = (pointer)local_13e8.super_Vector<double,_3U>.data_[1];
          if (cVar5 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1378);
          }
          local_13a8[0] = (pointer)0x0;
          local_13a8[1] = (pointer)0x0;
          local_13a8[2] = (pointer)0x0;
          lVar18 = 0;
          do {
            local_13a8[lVar18] =
                 (pointer)((double)(&local_1378.bitsets_.
                                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                     ._M_impl.super__Vector_impl_data._M_start)[lVar18] +
                          (double)local_1318[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_13c8.super_Vector<double,_3U>.data_[0] = 0.0;
          local_13c8.super_Vector<double,_3U>.data_[1] = 0.0;
          local_13c8.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar18 = 0;
          do {
            local_13c8.super_Vector<double,_3U>.data_[lVar18] = (double)local_13a8[lVar18] * 0.5;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_13e8.super_Vector<double,_3U>.data_[2] =
               local_13c8.super_Vector<double,_3U>.data_[2];
          local_13e8.super_Vector<double,_3U>.data_[0] =
               local_13c8.super_Vector<double,_3U>.data_[0];
          local_13e8.super_Vector<double,_3U>.data_[1] =
               local_13c8.super_Vector<double,_3U>.data_[1];
          if (cVar5 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,&local_13e8);
          }
          dVar9 = 0.0;
          lVar18 = 0;
          do {
            dVar3 = local_13e8.super_Vector<double,_3U>.data_[lVar18];
            dVar9 = dVar9 + dVar3 * dVar3;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          if (dVar9 < 0.0) {
            local_1388 = sqrt(dVar9);
          }
          else {
            local_1388 = SQRT(dVar9);
          }
          local_13a8[0] = (pointer)0x0;
          local_13a8[1] = (pointer)0x0;
          local_13a8[2] = (pointer)0x0;
          lVar18 = 0;
          do {
            local_13a8[lVar18] =
                 (pointer)((double)(&local_1378.bitsets_.
                                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                     ._M_impl.super__Vector_impl_data._M_start)[lVar18] -
                          (double)local_1318[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_13c8.super_Vector<double,_3U>.data_[2] = (double)local_13a8[2];
          local_13c8.super_Vector<double,_3U>.data_[0] = (double)local_13a8[0];
          local_13c8.super_Vector<double,_3U>.data_[1] = (double)local_13a8[1];
          if (cVar5 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,&local_13c8);
          }
          dVar9 = 0.0;
          lVar18 = 0;
          do {
            dVar3 = local_13e8.super_Vector<double,_3U>.data_[lVar18];
            dVar9 = dVar9 + dVar3 * dVar3;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          lVar18 = 0;
          do {
            local_13e8.super_Vector<double,_3U>.data_[lVar18] =
                 local_13e8.super_Vector<double,_3U>.data_[lVar18] / dVar9;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          dVar9 = 0.0;
          lVar18 = 0;
          do {
            dVar3 = local_13c8.super_Vector<double,_3U>.data_[lVar18];
            dVar9 = dVar9 + dVar3 * dVar3;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          lVar18 = 0;
          do {
            local_13c8.super_Vector<double,_3U>.data_[lVar18] =
                 local_13c8.super_Vector<double,_3U>.data_[lVar18] / dVar9;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          dVar9 = 0.0;
          lVar18 = 0;
          do {
            dVar9 = dVar9 + local_13e8.super_Vector<double,_3U>.data_[lVar18] *
                            local_13c8.super_Vector<double,_3U>.data_[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          if (local_1388 < this->len_) {
            iVar10 = (int)(local_1388 / this->deltaR_);
            pdVar6 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6[iVar10] = dVar9 + pdVar6[iVar10];
            piVar2 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar10;
            *piVar2 = *piVar2 + 1;
          }
          pSVar12 = SelectionManager::nextSelected(this_00,&local_13ac);
        }
      }
      else {
        if ((this->evaluator2_).isDynamic_ == true) {
          SelectionEvaluator::evaluate(&local_1378,local_12a0);
          lVar18 = 0;
          do {
            std::vector<bool,_std::allocator<bool>_>::operator=
                      ((vector<bool,_std::allocator<bool>_> *)
                       ((long)&(((this->seleMan2_).ss_.bitsets_.
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_> + lVar18),
                       (vector<bool,_std::allocator<bool>_> *)
                       ((long)&((local_1378.bitsets_.
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       lVar18));
            lVar18 = lVar18 + 0x28;
          } while (lVar18 != 0xf0);
          std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                    (&local_1378.bitsets_);
        }
        iVar10 = OpenMDBitSet::countBits
                           ((this->seleMan1_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        iVar11 = OpenMDBitSet::countBits
                           ((this->seleMan2_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        if (iVar10 != iVar11) {
          snprintf(painCave.errMsg,2000,
                   "In frame %d, the number of selected StuntDoubles are\n\tnot the same in --sele1 and sele2\n"
                   ,(ulong)local_137c);
          painCave.isFatal = 0;
          painCave.severity = 3;
          simError();
        }
        pSVar12 = SelectionManager::beginSelected(this_00,&local_13ac);
        pSVar14 = SelectionManager::beginSelected(local_1320,&local_1324);
        while ((pSVar14 != (StuntDouble *)0x0 && (pSVar12 != (StuntDouble *)0x0))) {
          lVar18 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar12->storage_);
          local_13e8.super_Vector<double,_3U>.data_[2] =
               *(double *)(lVar18 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
          pdVar1 = (double *)(lVar18 + (long)pSVar12->localIndex_ * 0x18);
          local_13e8.super_Vector<double,_3U>.data_[0] = *pdVar1;
          local_13e8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
          local_1318[0] = (pointer)0x0;
          local_1318[1] = (pointer)0x0;
          local_1318[2] = (pointer)0x0;
          lVar18 = 0;
          do {
            local_1318[lVar18] =
                 (pointer)(local_12d0.super_Vector<double,_3U>.data_[lVar18] -
                          local_13e8.super_Vector<double,_3U>.data_[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_1318[2];
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = local_1318[0];
          local_1378.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_finish = local_1318[1];
          if (cVar5 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1378);
          }
          lVar18 = *(long *)((long)&(pSVar14->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar14->storage_);
          local_13c8.super_Vector<double,_3U>.data_[2] =
               *(double *)(lVar18 + 0x10 + (long)pSVar14->localIndex_ * 0x18);
          pdVar1 = (double *)(lVar18 + (long)pSVar14->localIndex_ * 0x18);
          local_13c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
          local_13c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
          local_13e8.super_Vector<double,_3U>.data_[0] = 0.0;
          local_13e8.super_Vector<double,_3U>.data_[1] = 0.0;
          local_13e8.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar18 = 0;
          do {
            local_13e8.super_Vector<double,_3U>.data_[lVar18] =
                 local_12d0.super_Vector<double,_3U>.data_[lVar18] -
                 local_13c8.super_Vector<double,_3U>.data_[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_1318[2] = (pointer)local_13e8.super_Vector<double,_3U>.data_[2];
          local_1318[0] = (pointer)local_13e8.super_Vector<double,_3U>.data_[0];
          local_1318[1] = (pointer)local_13e8.super_Vector<double,_3U>.data_[1];
          if (cVar5 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1378);
          }
          local_13a8[0] = (pointer)0x0;
          local_13a8[1] = (pointer)0x0;
          local_13a8[2] = (pointer)0x0;
          lVar18 = 0;
          do {
            local_13a8[lVar18] =
                 (pointer)((double)(&local_1378.bitsets_.
                                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                     ._M_impl.super__Vector_impl_data._M_start)[lVar18] +
                          (double)local_1318[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_13c8.super_Vector<double,_3U>.data_[0] = 0.0;
          local_13c8.super_Vector<double,_3U>.data_[1] = 0.0;
          local_13c8.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar18 = 0;
          do {
            local_13c8.super_Vector<double,_3U>.data_[lVar18] = (double)local_13a8[lVar18] * 0.5;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_13e8.super_Vector<double,_3U>.data_[2] =
               local_13c8.super_Vector<double,_3U>.data_[2];
          local_13e8.super_Vector<double,_3U>.data_[0] =
               local_13c8.super_Vector<double,_3U>.data_[0];
          local_13e8.super_Vector<double,_3U>.data_[1] =
               local_13c8.super_Vector<double,_3U>.data_[1];
          if (cVar5 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,&local_13e8);
          }
          local_13a8[0] = (pointer)0x0;
          local_13a8[1] = (pointer)0x0;
          local_13a8[2] = (pointer)0x0;
          lVar18 = 0;
          do {
            local_13a8[lVar18] =
                 (pointer)((double)(&local_1378.bitsets_.
                                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                     ._M_impl.super__Vector_impl_data._M_start)[lVar18] -
                          (double)local_1318[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_13c8.super_Vector<double,_3U>.data_[2] = (double)local_13a8[2];
          local_13c8.super_Vector<double,_3U>.data_[0] = (double)local_13a8[0];
          local_13c8.super_Vector<double,_3U>.data_[1] = (double)local_13a8[1];
          if (cVar5 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,&local_13c8);
          }
          dVar9 = 0.0;
          lVar18 = 0;
          do {
            dVar3 = local_13e8.super_Vector<double,_3U>.data_[lVar18];
            dVar9 = dVar9 + dVar3 * dVar3;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          if (dVar9 < 0.0) {
            local_1388 = sqrt(dVar9);
          }
          else {
            local_1388 = SQRT(dVar9);
          }
          dVar9 = 0.0;
          lVar18 = 0;
          do {
            dVar3 = local_13e8.super_Vector<double,_3U>.data_[lVar18];
            dVar9 = dVar9 + dVar3 * dVar3;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          lVar18 = 0;
          do {
            local_13e8.super_Vector<double,_3U>.data_[lVar18] =
                 local_13e8.super_Vector<double,_3U>.data_[lVar18] / dVar9;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          dVar9 = 0.0;
          lVar18 = 0;
          do {
            dVar3 = local_13c8.super_Vector<double,_3U>.data_[lVar18];
            dVar9 = dVar9 + dVar3 * dVar3;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          lVar18 = 0;
          do {
            local_13c8.super_Vector<double,_3U>.data_[lVar18] =
                 local_13c8.super_Vector<double,_3U>.data_[lVar18] / dVar9;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          dVar9 = 0.0;
          lVar18 = 0;
          do {
            dVar9 = dVar9 + local_13e8.super_Vector<double,_3U>.data_[lVar18] *
                            local_13c8.super_Vector<double,_3U>.data_[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          if (local_1388 < this->len_) {
            iVar10 = (int)(local_1388 / this->deltaR_);
            pdVar6 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6[iVar10] = dVar9 + pdVar6[iVar10];
            piVar2 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar10;
            *piVar2 = *piVar2 + 1;
          }
          pSVar12 = SelectionManager::nextSelected(this_00,&local_13ac);
          pSVar14 = SelectionManager::nextSelected(local_1320,&local_1324);
        }
      }
      whichFrame = local_137c + (this->super_StaticAnalyser).step_;
    } while ((int)whichFrame < local_1328);
  }
  processHistogram(this);
  writeAngleR(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void AngleR::process() {
    StuntDouble* sd1;
    StuntDouble* sd2;
    int ii;
    int jj;
    RealType distance;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Thermo thermo(info_);
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    nProcessed_ = nFrames / step_;

    std::fill(avgAngleR_.begin(), avgAngleR_.end(), 0.0);
    std::fill(histogram_.begin(), histogram_.end(), 0.0);
    std::fill(count_.begin(), count_.end(), 0);

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Vector3d CenterOfMass = thermo.getCom();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (doVect_) {
        for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
             sd1 = seleMan1_.nextSelected(ii)) {
          Vector3d pos = sd1->getPos();

          Vector3d r1 = CenterOfMass - pos;
          distance    = r1.length();
          // only do this if the stunt double actually has a vector associated
          // with it
          if (sd1->isDirectional()) {
            Vector3d vec = sd1->getA().transpose() * V3Z;
            vec.normalize();
            r1.normalize();
            RealType cosangle = dot(r1, vec);

            if (distance < len_) {
              int whichBin = int(distance / deltaR_);
              histogram_[whichBin] += cosangle;
              count_[whichBin] += 1;
            }
          }
        }
      } else {
        if (doOffset_) {
          for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
               sd1 = seleMan1_.nextSelected(ii)) {
            // This will require careful rewriting if StaticProps is
            // ever parallelized.  For an example, see
            // Thermo::getTaggedAtomPairDistance
            Vector3d r1;

            if (doOffset2_) {
              int sd1Aind       = sd1->getGlobalIndex() + seleOffset2_;
              StuntDouble* sd1A = info_->getIOIndexToIntegrableObject(sd1Aind);
              r1                = CenterOfMass - sd1A->getPos();
            } else {
              r1 = CenterOfMass - sd1->getPos();
            }

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            int sd2Index = sd1->getGlobalIndex() + seleOffset_;
            sd2          = info_->getIOIndexToIntegrableObject(sd2Index);

            Vector3d r2 = CenterOfMass - sd2->getPos();
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            Vector3d rc = 0.5 * (r1 + r2);
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rc);

            distance = rc.length();

            Vector3d vec = r1 - r2;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            rc.normalize();
            vec.normalize();
            RealType cosangle = dot(rc, vec);
            if (distance < len_) {
              int whichBin = int(distance / deltaR_);
              histogram_[whichBin] += cosangle;
              count_[whichBin] += 1;
            }
          }
        } else {
          if (evaluator2_.isDynamic()) {
            seleMan2_.setSelectionSet(evaluator2_.evaluate());
          }

          if (seleMan1_.getSelectionCount() != seleMan2_.getSelectionCount()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "In frame %d, the number of selected StuntDoubles are\n"
                     "\tnot the same in --sele1 and sele2\n",
                     istep);
            painCave.severity = OPENMD_INFO;
            painCave.isFatal  = 0;
            simError();
          }

          for (sd1                             = seleMan1_.beginSelected(ii),
              sd2                              = seleMan2_.beginSelected(jj);
               sd1 != NULL && sd2 != NULL; sd1 = seleMan1_.nextSelected(ii),
              sd2                              = seleMan2_.nextSelected(jj)) {
            Vector3d r1 = CenterOfMass - sd1->getPos();
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            Vector3d r2 = CenterOfMass - sd2->getPos();
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            Vector3d rc = 0.5 * (r1 + r2);
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rc);

            Vector3d vec = r1 - r2;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            distance = rc.length();

            rc.normalize();
            vec.normalize();
            RealType cosangle = dot(rc, vec);
            if (distance < len_) {
              int whichBin = int(distance / deltaR_);
              histogram_[whichBin] += cosangle;
              count_[whichBin] += 1;
            }
          }
        }
      }
    }
    processHistogram();
    writeAngleR();
  }